

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void TestOneTruncate(char *path,int64 limit,int64 keep,int64 dsize,int64 ksize,int64 expect)

{
  int iVar1;
  long *plVar2;
  ssize_t sVar3;
  ostream *poVar4;
  __off_t _Var5;
  LogMessage local_2c8;
  LogMessageVoidify local_2b1;
  int64 local_2b0;
  long local_2a8;
  int local_29c;
  long lStack_298;
  int bytes_2;
  int64 checked;
  char *p;
  code *local_280;
  undefined8 uStack_278;
  LogMessage local_270;
  LogMessageVoidify local_259;
  void *local_258;
  char *buf;
  size_t buf_size;
  code *local_240;
  undefined8 uStack_238;
  LogMessage local_230;
  LogMessageVoidify local_219;
  CheckOpString local_218;
  LogMessage local_210;
  long local_200;
  long local_1f8;
  string *local_1f0;
  _Check_string *_result;
  code *local_1e0;
  undefined8 uStack_1d8;
  LogMessage local_1d0;
  LogMessageVoidify local_1b9;
  undefined1 local_1b8 [8];
  stat statbuf;
  LogMessage local_110;
  LogMessageVoidify local_f9;
  int64 local_f8;
  long local_f0;
  int local_e8;
  byte local_e1;
  int bytes_1;
  undefined8 uStack_d8;
  LogMessage local_d0;
  LogMessageVoidify local_b9;
  size_t local_b8;
  long local_b0;
  int local_a4;
  long lStack_a0;
  int bytes;
  int64 written;
  size_t keep_size;
  size_t discard_size;
  char *keepstr;
  char *discardstr;
  byte local_61;
  code *local_60;
  undefined8 uStack_58;
  LogMessage local_50;
  LogMessageVoidify local_3d;
  int local_3c;
  int64 iStack_38;
  int fd;
  int64 expect_local;
  int64 ksize_local;
  int64 dsize_local;
  int64 keep_local;
  int64 limit_local;
  char *path_local;
  
  iStack_38 = expect;
  expect_local = ksize;
  ksize_local = dsize;
  dsize_local = keep;
  keep_local = limit;
  limit_local = (int64)path;
  local_3c = open(path,0x242,0x180);
  local_61 = 0;
  if (local_3c == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_3d);
    local_60 = google::LogMessage::SendToLog;
    uStack_58 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x308,3,0,expect);
    local_61 = 1;
    poVar4 = google::LogMessage::stream(&local_50);
    poVar4 = std::operator<<(poVar4,"fd = open(path, O_RDWR | O_CREAT | O_TRUNC, 0600)");
    google::LogMessageVoidify::operator&(&local_3d,poVar4);
  }
  if ((local_61 & 1) != 0) {
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_50);
  }
  keepstr = "DISCARDME!";
  discard_size = (size_t)anon_var_dwarf_c365;
  keep_size = strlen("DISCARDME!");
  written = strlen((char *)discard_size);
  for (lStack_a0 = 0; lStack_a0 < ksize_local; lStack_a0 = local_a4 + lStack_a0) {
    local_b0 = ksize_local - lStack_a0;
    local_b8 = keep_size;
    plVar2 = std::min<long>(&local_b0,(long *)&local_b8);
    local_a4 = (int)*plVar2;
    sVar3 = write(local_3c,keepstr,(long)local_a4);
    local_e1 = 0;
    if (sVar3 == -1) {
      google::LogMessageVoidify::LogMessageVoidify(&local_b9);
      _bytes_1 = google::LogMessage::SendToLog;
      uStack_d8 = 0;
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x311,3,0,expect);
      local_e1 = 1;
      poVar4 = google::LogMessage::stream(&local_d0);
      poVar4 = std::operator<<(poVar4,"write(fd, discardstr, bytes)");
      google::LogMessageVoidify::operator&(&local_b9,poVar4);
    }
    if ((local_e1 & 1) != 0) {
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_d0);
    }
  }
  for (lStack_a0 = 0; lStack_a0 < expect_local; lStack_a0 = local_e8 + lStack_a0) {
    local_f0 = expect_local - lStack_a0;
    local_f8 = written;
    plVar2 = std::min<long>(&local_f0,&local_f8);
    local_e8 = (int)*plVar2;
    sVar3 = write(local_3c,(void *)discard_size,(long)local_e8);
    statbuf.__glibc_reserved[2]._7_1_ = 0;
    if (sVar3 == -1) {
      google::LogMessageVoidify::LogMessageVoidify(&local_f9);
      google::ErrnoLogMessage::ErrnoLogMessage
                ((ErrnoLogMessage *)&local_110,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                 ,0x317,3,0,expect);
      statbuf.__glibc_reserved[2]._7_1_ = 1;
      poVar4 = google::LogMessage::stream(&local_110);
      poVar4 = std::operator<<(poVar4,"write(fd, keepstr, bytes)");
      google::LogMessageVoidify::operator&(&local_f9,poVar4);
    }
    if ((statbuf.__glibc_reserved[2]._7_1_ & 1) != 0) {
      google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_110);
    }
  }
  google::TruncateLogFile((char *)limit_local,keep_local,dsize_local);
  iVar1 = fstat(local_3c,(stat *)local_1b8);
  _result._7_1_ = 0;
  if (iVar1 == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_1b9);
    local_1e0 = google::LogMessage::SendToLog;
    uStack_1d8 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,799,3,0,expect);
    _result._7_1_ = 1;
    poVar4 = google::LogMessage::stream(&local_1d0);
    poVar4 = std::operator<<(poVar4,"fstat(fd, &statbuf)");
    google::LogMessageVoidify::operator&(&local_1b9,poVar4);
  }
  if ((_result._7_1_ & 1) != 0) {
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_1d0);
  }
  local_1f8 = google::GetReferenceableValue(statbuf.st_rdev);
  local_200 = google::GetReferenceableValue(iStack_38);
  local_1f0 = google::Check_EQImpl<long,long>(&local_1f8,&local_200,"statbuf.st_size == expect");
  if (local_1f0 != (string *)0x0) {
    google::CheckOpString::CheckOpString(&local_218,local_1f0);
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_210,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,800,&local_218);
    google::LogMessage::stream(&local_210);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_210);
  }
  _Var5 = lseek(local_3c,0,0);
  buf_size._7_1_ = 0;
  if (_Var5 == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_219);
    local_240 = google::LogMessage::SendToLog;
    uStack_238 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_230,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x321,3,0,expect);
    buf_size._7_1_ = 1;
    poVar4 = google::LogMessage::stream(&local_230);
    poVar4 = std::operator<<(poVar4,"lseek(fd, 0, SEEK_SET)");
    google::LogMessageVoidify::operator&(&local_219,poVar4);
  }
  if ((buf_size._7_1_ & 1) != 0) {
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_230);
  }
  buf = (char *)(statbuf.st_rdev + 1);
  local_258 = operator_new__((size_t)buf);
  memset(local_258,0,(size_t)buf);
  sVar3 = read(local_3c,local_258,(size_t)buf);
  p._7_1_ = 0;
  if (sVar3 == -1) {
    google::LogMessageVoidify::LogMessageVoidify(&local_259);
    local_280 = google::LogMessage::SendToLog;
    uStack_278 = 0;
    google::ErrnoLogMessage::ErrnoLogMessage
              ((ErrnoLogMessage *)&local_270,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x327,3,0,expect);
    p._7_1_ = 1;
    poVar4 = google::LogMessage::stream(&local_270);
    poVar4 = std::operator<<(poVar4,"read(fd, buf, buf_size)");
    google::LogMessageVoidify::operator&(&local_259,poVar4);
  }
  if ((p._7_1_ & 1) != 0) {
    google::ErrnoLogMessage::~ErrnoLogMessage((ErrnoLogMessage *)&local_270);
  }
  checked = (int64)local_258;
  lStack_298 = 0;
  while( true ) {
    if (iStack_38 <= lStack_298) {
      close(local_3c);
      if (local_258 != (void *)0x0) {
        operator_delete__(local_258);
      }
      return;
    }
    local_2a8 = iStack_38 - lStack_298;
    local_2b0 = written;
    plVar2 = std::min<long>(&local_2a8,&local_2b0);
    local_29c = (int)*plVar2;
    iVar1 = memcmp((void *)checked,(void *)discard_size,(long)local_29c);
    if (iVar1 != 0) break;
    lStack_298 = local_29c + lStack_298;
  }
  google::LogMessageVoidify::LogMessageVoidify(&local_2b1);
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x32d);
  poVar4 = google::LogMessage::stream(&local_2c8);
  poVar4 = std::operator<<(poVar4,"Check failed: !memcmp(p, keepstr, bytes) ");
  google::LogMessageVoidify::operator&(&local_2b1,poVar4);
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2c8);
}

Assistant:

static void TestOneTruncate(const char *path, int64 limit, int64 keep,
                            int64 dsize, int64 ksize, int64 expect) {
  int fd;
  CHECK_ERR(fd = open(path, O_RDWR | O_CREAT | O_TRUNC, 0600));

  const char *discardstr = "DISCARDME!", *keepstr = "KEEPME!";
  const size_t discard_size = strlen(discardstr), keep_size = strlen(keepstr);

  // Fill the file with the requested data; first discard data, then kept data
  int64 written = 0;
  while (written < dsize) {
    int bytes = min<int64>(dsize - written, discard_size);
    CHECK_ERR(write(fd, discardstr, bytes));
    written += bytes;
  }
  written = 0;
  while (written < ksize) {
    int bytes = min<int64>(ksize - written, keep_size);
    CHECK_ERR(write(fd, keepstr, bytes));
    written += bytes;
  }

  TruncateLogFile(path, limit, keep);

  // File should now be shorter
  struct stat statbuf;
  CHECK_ERR(fstat(fd, &statbuf));
  CHECK_EQ(statbuf.st_size, expect);
  CHECK_ERR(lseek(fd, 0, SEEK_SET));

  // File should contain the suffix of the original file
  const size_t buf_size = statbuf.st_size + 1;
  char* buf = new char[buf_size];
  memset(buf, 0, buf_size);
  CHECK_ERR(read(fd, buf, buf_size));

  const char *p = buf;
  int64 checked = 0;
  while (checked < expect) {
    int bytes = min<int64>(expect - checked, keep_size);
    CHECK(!memcmp(p, keepstr, bytes));
    checked += bytes;
  }
  close(fd);
  delete[] buf;
}